

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall
gulcalc::setmaxloss(gulcalc *this,
                   vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   *gilv)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pgVar4;
  size_t i;
  ulong uVar5;
  pointer pgVar6;
  int iVar7;
  pointer pgVar8;
  float fVar9;
  
  pvVar2 = (gilv->
           super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (gilv->
           super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (uVar5 = 3; uVar5 < (ulong)(((long)pvVar3 - (long)pvVar2) / 0x18); uVar5 = uVar5 + 1) {
    pgVar4 = *(pointer *)
              ((long)&pvVar2[uVar5].
                      super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                      super__Vector_impl_data + 8);
    fVar9 = 0.0;
    iVar7 = 0;
    pgVar6 = pvVar2[uVar5].super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl
             .super__Vector_impl_data._M_start;
    for (pgVar8 = pgVar6; pgVar8 != pgVar4; pgVar8 = pgVar8 + 1) {
      dVar1 = pgVar8->loss;
      if ((double)fVar9 < dVar1) {
        iVar7 = 0;
        fVar9 = (float)dVar1;
      }
      iVar7 = iVar7 + (uint)((double)fVar9 == dVar1);
    }
    for (; pgVar6 != pgVar4; pgVar6 = pgVar6 + 1) {
      pgVar6->loss = (double)(-(ulong)(pgVar6->loss == (double)fVar9) &
                             (ulong)(pgVar6->loss / (double)iVar7));
    }
  }
  return;
}

Assistant:

void gulcalc::setmaxloss(std::vector<std::vector<gulItemIDLoss>> &gilv) {

	for (size_t i = 3; i < gilv.size(); i++) {

		OASIS_FLOAT max_loss = 0.0;
		int max_loss_count = 0;

		// First loop: find maximum loss and count occurrences
		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {
			if (iter->loss > max_loss) {
				max_loss = iter->loss;
				max_loss_count = 0;
			}
			if (iter->loss == max_loss) max_loss_count++;
			iter++;
		}

		// Second loop: distribute maximum losses evenly among highest
		// contributing subperils and set other losses to 0
		iter = gilv[i].begin();
		while (iter != gilv[i].end()) {
			if (iter->loss == max_loss) iter->loss /= max_loss_count;
			else iter->loss = 0;
			iter++;
		}

	}

}